

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HierarchicalTaskNetworkComponent.cpp
# Opt level: O3

void __thiscall
AI::HierarchicalTaskNetworkComponent::fixedTick(HierarchicalTaskNetworkComponent *this)

{
  float in_XMM0_Da;
  
  fixedTick((HierarchicalTaskNetworkComponent *)
            &this[-1].utilityScores.
             super__Vector_base<AI::FUtilityScores,_std::allocator<AI::FUtilityScores>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage,in_XMM0_Da);
  return;
}

Assistant:

void HierarchicalTaskNetworkComponent::fixedTick(float dt)
{
	auto playerIdentified = state.current.flags[WorldStateIdentifier::PlayerIdentified];

	sense();
	perceive();
	purgeMemoryOfIgnoredActors();
	produceFacts();

	tickEmotionalState(dt);

	Math::Vector3 eyePosition;
	//FRotator rotation;
	//AIOwner->GetCharacter()->GetActorEyesViewPoint(eyePosition, rotation);	
	state.current.vectors[WorldStateIdentifier::CurrentPosition] = owner->GetActorLocation(); //eyePosition;

	state.current.vectors[WorldStateIdentifier::CurrentPosition_Feet] = owner->GetActorLocation();
	//state.current.vectors[WorldStateIdentifier::CurrentPosition_Feet].z -= Cast<AAICharacter>(AIOwner->GetPawn())->GetCapsuleComponent()->GetScaledCapsuleHalfHeight();

	auto player = GameplayStatics::GetPlayerCharacter(getWorld(), 0);
	if (player != nullptr)
	{
		//player->GetActorEyesViewPoint(eyePosition, rotation);

		if (state.current.flags[WorldStateIdentifier::PlayerIdentified])
		{
			state.current.vectors[WorldStateIdentifier::PlayerPosition] = eyePosition;
			state.produceFactVector(ConsumableFact::Player_LastKnownLocation, eyePosition);	
		}
	}	

	decide();
	performTask(dt);

	auto gameMode = getWorld()->getAuthGameMode();
	auto& tasks = gameMode->getAvailableTasks();
	
	evaluatePlan(planner.plan, state, worldQuerySystem, planner.parameters, tasks.satisfiablePredicates);		

	if (isBeingDebugViewed)
	{
		updateHUD_PlanPath();	
	}	

	state.valueTrackers[WorldStateIdentifier::PlayerIdentified].update(state.current.flags[WorldStateIdentifier::PlayerIdentified], dt);
	if (!playerIdentified && state.current.flags[WorldStateIdentifier::PlayerIdentified])
	{
		state.produceFactFlag(ConsumableFact::PlayerRecentlyIdentified, true);
	}

	barker.update(dt);
}